

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomMesh *mesh,
               string *warn,string *err,PrimReconstructOptions *options)

{
  FamilyType FVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  __type _Var4;
  int iVar5;
  Relationship *pRVar6;
  GeomMesh *prop_name;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Attribute *pAVar9;
  AttrMeta *pAVar10;
  AttrMeta *pAVar11;
  FamilyType *pFVar12;
  string *str;
  mapped_type *pmVar13;
  size_type sVar14;
  Property *pPVar15;
  mapped_type *this;
  ostream *poVar16;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  undefined8 in_stack_ffffffffffffca18;
  undefined4 uVar18;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *target;
  bool local_3589;
  bool local_3549;
  bool local_3521;
  bool local_34f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3420 [32];
  string local_3400 [32];
  ostringstream local_33e0 [8];
  ostringstream ss_w_4;
  Token local_3258;
  _Base_ptr local_3238;
  undefined1 local_3230;
  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3228;
  undefined1 local_3208 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_3;
  Attribute *attr_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31b0 [32];
  ostringstream local_3190 [8];
  ostringstream ss_w_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3018;
  string local_2ff8;
  FamilyType local_2fd4;
  undefined1 local_2fd0 [8];
  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType> familyType;
  string local_2d90;
  undefined1 local_2d70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_2d50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d10 [39];
  allocator local_2ce9;
  string local_2ce8 [32];
  string local_2cc8;
  ostringstream local_2ca8 [8];
  ostringstream ss_e_14;
  allocator local_2b29;
  undefined1 local_2b28 [32];
  undefined1 local_2b08 [40];
  ParseResult ret_10;
  allocator local_2aa9;
  value_type local_2aa8 [4];
  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2a88;
  allocator local_2a61;
  string local_2a60;
  undefined1 local_2a40 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_2;
  Attribute *attr_4;
  allocator local_2a01;
  value_type local_2a00 [5];
  Attribute *attr_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29b8 [32];
  ostringstream local_2998 [8];
  ostringstream ss_w_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2820;
  string local_2800;
  allocator local_27d9;
  key_type local_27d8 [6];
  allocator local_27a1;
  value_type local_27a0 [4];
  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2780;
  allocator local_2759;
  string local_2758;
  undefined1 local_2738 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_26f9;
  value_type local_26f8 [5];
  Attribute *attr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26b0 [32];
  ostringstream local_2690 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2518;
  string local_24f8;
  allocator local_24d1;
  key_type local_24d0 [6];
  allocator local_2499;
  value_type local_2498 [4];
  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2478;
  allocator local_2451;
  string local_2450;
  undefined1 local_2430 [8];
  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr;
  allocator local_23f1;
  value_type local_23f0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23b0 [32];
  ostringstream local_2390 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2218;
  string local_21f8;
  allocator local_21d1;
  key_type local_21d0 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2190 [39];
  allocator local_2169;
  string local_2168 [32];
  string local_2148;
  ostringstream local_2128 [8];
  ostringstream ss_e_13;
  allocator local_1fa9;
  undefined1 local_1fa8 [32];
  undefined1 local_1f88 [40];
  ParseResult ret_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f20 [39];
  allocator local_1ef9;
  string local_1ef8 [32];
  string local_1ed8;
  ostringstream local_1eb8 [8];
  ostringstream ss_e_12;
  allocator local_1d39;
  undefined1 local_1d38 [32];
  undefined1 local_1d18 [40];
  ParseResult ret_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cb0 [39];
  allocator local_1c89;
  string local_1c88 [32];
  string local_1c68;
  ostringstream local_1c48 [8];
  ostringstream ss_e_11;
  allocator local_1ac9;
  undefined1 local_1ac8 [32];
  undefined1 local_1aa8 [32];
  undefined1 local_1a88 [8];
  ParseResult ret_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a40 [39];
  allocator local_1a19;
  string local_1a18 [32];
  string local_19f8;
  ostringstream local_19d8 [8];
  ostringstream ss_e_10;
  allocator local_1859;
  undefined1 local_1858 [32];
  undefined1 local_1838 [32];
  undefined1 local_1818 [8];
  ParseResult ret_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17d0 [39];
  allocator local_17a9;
  string local_17a8 [32];
  string local_1788;
  ostringstream local_1768 [8];
  ostringstream ss_e_9;
  allocator local_15e9;
  undefined1 local_15e8 [32];
  undefined1 local_15c8 [32];
  undefined1 local_15a8 [8];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1560 [39];
  allocator local_1539;
  string local_1538 [32];
  string local_1518;
  ostringstream local_14f8 [8];
  ostringstream ss_e_8;
  allocator local_1379;
  undefined1 local_1378 [32];
  undefined1 local_1358 [32];
  undefined1 local_1338 [8];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0 [39];
  allocator local_12c9;
  string local_12c8 [32];
  string local_12a8;
  ostringstream local_1288 [8];
  ostringstream ss_e_7;
  allocator local_1109;
  undefined1 local_1108 [32];
  undefined1 local_10e8 [32];
  undefined1 local_10c8 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080 [39];
  allocator local_1059;
  string local_1058 [32];
  string local_1038;
  ostringstream local_1018 [8];
  ostringstream ss_e_6;
  allocator local_e99;
  undefined1 local_e98 [32];
  undefined1 local_e78 [32];
  undefined1 local_e58 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10 [39];
  allocator local_de9;
  string local_de8 [32];
  string local_dc8;
  ostringstream local_da8 [8];
  ostringstream ss_e_5;
  allocator local_c29;
  undefined1 local_c28 [32];
  undefined1 local_c08 [32];
  undefined1 local_be8 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0 [39];
  allocator local_b79;
  string local_b78 [32];
  string local_b58;
  ostringstream local_b38 [8];
  ostringstream ss_e_4;
  allocator local_9b9;
  undefined1 local_9b8 [32];
  undefined1 local_998 [32];
  undefined1 local_978 [8];
  ParseResult ret;
  Relationship *rel_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918 [39];
  allocator local_8f1;
  string local_8f0 [32];
  string local_8d0;
  ostringstream local_8b0 [8];
  ostringstream ss_e_3;
  allocator local_731;
  key_type local_730 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0 [39];
  allocator local_6c9;
  string local_6c8 [32];
  string local_6a8;
  ostringstream local_688 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [32];
  string local_488;
  ostringstream local_468 [8];
  ostringstream ss_e_1;
  Relationship *rel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  string local_260;
  ostringstream local_240 [8];
  ostringstream ss_e;
  allocator local_c1;
  key_type local_c0 [4];
  undefined1 local_a0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_78 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  anon_class_1_0_00000001 FamilyTypeHandler;
  anon_class_1_0_00000001 FaceVaryingLinearInterpolationHandler;
  anon_class_1_0_00000001 InterpolateBoundaryHandler;
  anon_class_1_0_00000001 SubdivisionSchemeHandler;
  string *err_local;
  string *warn_local;
  GeomMesh *mesh_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  uVar18 = (undefined4)((ulong)in_stack_ffffffffffffca18 >> 0x20);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_78);
  bVar3 = (bool)(options->strict_allowedToken_check & 1);
  target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            *)CONCAT44(uVar18,(uint)bVar3);
  prop_name = mesh;
  bVar3 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_78,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&mesh->super_GPrim,warn,err,bVar3);
  if (!bVar3) {
    spec_local._7_1_ = 0;
    goto LAB_002c569c;
  }
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(properties);
LAB_002c1cd7:
  bVar3 = ::std::operator!=(&__end2,(_Self *)&prop);
  if (!bVar3) goto LAB_002c5691;
  local_a0 = (undefined1  [8])
             ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator*(&__end2);
  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"skel:skeleton");
  if (bVar3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_c0,"skel:skeleton",&local_c1);
    sVar14 = ::std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,local_c0);
    ::std::__cxx11::string::~string((string *)local_c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (sVar14 != 0) goto LAB_002c5680;
    bVar3 = Property::is_relationship((Property *)((long)local_a0 + 0x20));
    if (!bVar3) {
      ::std::__cxx11::ostringstream::ostringstream(local_240);
      poVar16 = ::std::operator<<((ostream *)local_240,"[error]");
      poVar16 = ::std::operator<<(poVar16,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 );
      poVar16 = ::std::operator<<(poVar16,":");
      poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
      poVar16 = ::std::operator<<(poVar16,"():");
      poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe65);
      ::std::operator<<(poVar16," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_280,"Property `{}` must be a Relationship.",&local_281);
      fmt::format<char_const*>
                (&local_260,(fmt *)local_280,(string *)&kSkelSkeleton,(char **)prop_name);
      poVar16 = ::std::operator<<((ostream *)local_240,(string *)&local_260);
      ::std::operator<<(poVar16,"\n");
      ::std::__cxx11::string::~string((string *)&local_260);
      ::std::__cxx11::string::~string(local_280);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_2a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rel);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_2a8);
        ::std::__cxx11::string::~string((string *)local_2a8);
        ::std::__cxx11::string::~string((string *)&rel);
      }
      spec_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_240);
      goto LAB_002c569c;
    }
    pRVar6 = Property::get_relationship((Property *)((long)local_a0 + 0x20));
    bVar3 = Relationship::is_path(pRVar6);
    if (bVar3) {
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=(&mesh->skeleton,pRVar6);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,(value_type *)local_a0);
      goto LAB_002c5680;
    }
    bVar3 = Relationship::is_pathvector(pRVar6);
    if (bVar3) {
      sVar7 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        (&pRVar6->targetPathVector);
      if (sVar7 != 1) {
        ::std::__cxx11::ostringstream::ostringstream(local_468);
        poVar16 = ::std::operator<<((ostream *)local_468,"[error]");
        poVar16 = ::std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar16 = ::std::operator<<(poVar16,":");
        poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
        poVar16 = ::std::operator<<(poVar16,"():");
        poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe65);
        ::std::operator<<(poVar16," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4a8,"`{}` target is empty or has mutiple Paths. Must be single Path.",
                   &local_4a9);
        fmt::format<char_const*>
                  (&local_488,(fmt *)local_4a8,(string *)&kSkelSkeleton,(char **)prop_name);
        poVar16 = ::std::operator<<((ostream *)local_468,(string *)&local_488);
        ::std::operator<<(poVar16,"\n");
        ::std::__cxx11::string::~string((string *)&local_488);
        ::std::__cxx11::string::~string(local_4a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_4d0,local_4f0);
          ::std::__cxx11::string::operator=((string *)err,(string *)local_4d0);
          ::std::__cxx11::string::~string((string *)local_4d0);
          ::std::__cxx11::string::~string((string *)local_4f0);
        }
        spec_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_468);
        goto LAB_002c569c;
      }
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=(&mesh->skeleton,pRVar6);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,(value_type *)local_a0);
      goto LAB_002c5680;
    }
    bVar3 = Relationship::has_value(pRVar6);
    if (bVar3) {
      bVar3 = Relationship::is_blocked(pRVar6);
      if (bVar3) {
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=(&mesh->skeleton,pRVar6);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,(value_type *)local_a0);
        goto LAB_002c2362;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_688);
      poVar16 = ::std::operator<<((ostream *)local_688,"[error]");
      poVar16 = ::std::operator<<(poVar16,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 );
      poVar16 = ::std::operator<<(poVar16,":");
      poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
      poVar16 = ::std::operator<<(poVar16,"():");
      poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe65);
      ::std::operator<<(poVar16," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_6c8,"Internal error. Property `{}` is not a valid Relationship.",&local_6c9);
      fmt::format<char_const*>
                (&local_6a8,(fmt *)local_6c8,(string *)&kSkelSkeleton,(char **)prop_name);
      poVar16 = ::std::operator<<((ostream *)local_688,(string *)&local_6a8);
      ::std::operator<<(poVar16,"\n");
      ::std::__cxx11::string::~string((string *)&local_6a8);
      ::std::__cxx11::string::~string(local_6c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_6f0,local_710);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_6f0);
        ::std::__cxx11::string::~string((string *)local_6f0);
        ::std::__cxx11::string::~string((string *)local_710);
      }
      spec_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_688);
      goto LAB_002c569c;
    }
    nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=(&mesh->skeleton,pRVar6);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,(value_type *)local_a0);
  }
LAB_002c2362:
  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"skel:blendShapeTargets");
  if (bVar3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_730,"skel:blendShapeTargets",&local_731);
    sVar14 = ::std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,local_730);
    ::std::__cxx11::string::~string((string *)local_730);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_731);
    if (sVar14 == 0) {
      bVar3 = Property::is_relationship((Property *)((long)local_a0 + 0x20));
      if (!bVar3) {
        ::std::__cxx11::ostringstream::ostringstream(local_8b0);
        poVar16 = ::std::operator<<((ostream *)local_8b0,"[error]");
        poVar16 = ::std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar16 = ::std::operator<<(poVar16,":");
        poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
        poVar16 = ::std::operator<<(poVar16,"():");
        poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe66);
        ::std::operator<<(poVar16," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_8f0,"`{}` must be a Relationship",&local_8f1);
        fmt::format<char_const*>
                  (&local_8d0,(fmt *)local_8f0,(string *)&kSkelBlendShapeTargets,(char **)prop_name)
        ;
        poVar16 = ::std::operator<<((ostream *)local_8b0,(string *)&local_8d0);
        ::std::operator<<(poVar16,"\n");
        ::std::__cxx11::string::~string((string *)&local_8d0);
        ::std::__cxx11::string::~string(local_8f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_918,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rel_1);
          ::std::__cxx11::string::operator=((string *)err,(string *)local_918);
          ::std::__cxx11::string::~string((string *)local_918);
          ::std::__cxx11::string::~string((string *)&rel_1);
        }
        spec_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_8b0);
        goto LAB_002c569c;
      }
      pRVar6 = Property::get_relationship((Property *)((long)local_a0 + 0x20));
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&mesh->blendShapeTargets,pRVar6);
      pVar17 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_78,(value_type *)local_a0);
      ret.err.field_2._8_8_ = pVar17.first._M_node;
    }
  }
  else {
    ::std::__cxx11::string::string((string *)local_998,(string *)local_a0);
    prop_name = (GeomMesh *)((long)local_a0 + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_9b8,"points",&local_9b9);
    pPVar15 = (Property *)local_9b8;
    (anonymous_namespace)::
    ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
              ((ParseResult *)local_978,(_anonymous_namespace_ *)local_78,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_998,(string *)prop_name,pPVar15,(string *)&mesh->points,target);
    ::std::__cxx11::string::~string((string *)local_9b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
    ::std::__cxx11::string::~string((string *)local_998);
    if ((local_978._0_4_ == Success) || (local_978._0_4_ == AlreadyProcessed)) {
      __range2._4_4_ = 3;
    }
    else if (local_978._0_4_ == Unmatched) {
      __range2._4_4_ = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_b38);
      poVar16 = ::std::operator<<((ostream *)local_b38,"[error]");
      poVar16 = ::std::operator<<(poVar16,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 );
      poVar16 = ::std::operator<<(poVar16,":");
      poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
      poVar16 = ::std::operator<<(poVar16,"():");
      poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe67);
      ::std::operator<<(poVar16," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_b78,"Parsing attribute `{}` failed. Error: {}",&local_b79);
      prop_name = (GeomMesh *)&ret;
      fmt::format<char[7],std::__cxx11::string>
                (&local_b58,(fmt *)local_b78,(string *)"points",(char (*) [7])prop_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15);
      poVar16 = ::std::operator<<((ostream *)local_b38,(string *)&local_b58);
      ::std::operator<<(poVar16,"\n");
      ::std::__cxx11::string::~string((string *)&local_b58);
      ::std::__cxx11::string::~string(local_b78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b79);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_ba0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_1.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=((string *)err,(string *)local_ba0);
        ::std::__cxx11::string::~string((string *)local_ba0);
        ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      __range2._4_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_b38);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_978);
    if (__range2._4_4_ == 0) {
      ::std::__cxx11::string::string((string *)local_c08,(string *)local_a0);
      prop_name = (GeomMesh *)((long)local_a0 + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_c28,"normals",&local_c29);
      pPVar15 = (Property *)local_c28;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                ((ParseResult *)local_be8,(_anonymous_namespace_ *)local_78,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c08,(string *)prop_name,pPVar15,(string *)&mesh->normals,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                  *)target);
      ::std::__cxx11::string::~string((string *)local_c28);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c29);
      ::std::__cxx11::string::~string((string *)local_c08);
      if ((local_be8._0_4_ == Success) || (local_be8._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_be8._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_da8);
        poVar16 = ::std::operator<<((ostream *)local_da8,"[error]");
        poVar16 = ::std::operator<<(poVar16,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   );
        poVar16 = ::std::operator<<(poVar16,":");
        poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
        poVar16 = ::std::operator<<(poVar16,"():");
        poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe68);
        ::std::operator<<(poVar16," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_de8,"Parsing attribute `{}` failed. Error: {}",&local_de9);
        prop_name = (GeomMesh *)&ret_1;
        fmt::format<char[8],std::__cxx11::string>
                  (&local_dc8,(fmt *)local_de8,(string *)"normals",(char (*) [8])prop_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15);
        poVar16 = ::std::operator<<((ostream *)local_da8,(string *)&local_dc8);
        ::std::operator<<(poVar16,"\n");
        ::std::__cxx11::string::~string((string *)&local_dc8);
        ::std::__cxx11::string::~string(local_de8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_de9);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_e10,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=((string *)err,(string *)local_e10);
          ::std::__cxx11::string::~string((string *)local_e10);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_da8);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_be8);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)local_e78,(string *)local_a0);
        prop_name = (GeomMesh *)((long)local_a0 + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_e98,"faceVertexCounts",&local_e99);
        pPVar15 = (Property *)local_e98;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  ((ParseResult *)local_e58,(_anonymous_namespace_ *)local_78,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e78,(string *)prop_name,pPVar15,(string *)&mesh->faceVertexCounts,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *
                   )target);
        ::std::__cxx11::string::~string((string *)local_e98);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e99);
        ::std::__cxx11::string::~string((string *)local_e78);
        if ((local_e58._0_4_ == Success) || (local_e58._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_e58._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1018);
          poVar16 = ::std::operator<<((ostream *)local_1018,"[error]");
          poVar16 = ::std::operator<<(poVar16,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar16 = ::std::operator<<(poVar16,":");
          poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
          poVar16 = ::std::operator<<(poVar16,"():");
          poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe6a);
          ::std::operator<<(poVar16," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1058,"Parsing attribute `{}` failed. Error: {}",&local_1059);
          prop_name = (GeomMesh *)&ret_2;
          fmt::format<char[17],std::__cxx11::string>
                    (&local_1038,(fmt *)local_1058,(string *)"faceVertexCounts",
                     (char (*) [17])prop_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15);
          poVar16 = ::std::operator<<((ostream *)local_1018,(string *)&local_1038);
          ::std::operator<<(poVar16,"\n");
          ::std::__cxx11::string::~string((string *)&local_1038);
          ::std::__cxx11::string::~string(local_1058);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1059);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1080,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_3.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_1080);
            ::std::__cxx11::string::~string((string *)local_1080);
            ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1018);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_e58);
        if (__range2._4_4_ == 0) {
          ::std::__cxx11::string::string((string *)local_10e8,(string *)local_a0);
          prop_name = (GeomMesh *)((long)local_a0 + 0x20);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_1108,"faceVertexIndices",&local_1109);
          pPVar15 = (Property *)local_1108;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_10c8,(_anonymous_namespace_ *)local_78,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_10e8,(string *)prop_name,pPVar15,(string *)&mesh->faceVertexIndices,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)target);
          ::std::__cxx11::string::~string((string *)local_1108);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1109);
          ::std::__cxx11::string::~string((string *)local_10e8);
          if ((local_10c8._0_4_ == Success) || (local_10c8._0_4_ == AlreadyProcessed)) {
            __range2._4_4_ = 3;
          }
          else if (local_10c8._0_4_ == Unmatched) {
            __range2._4_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1288);
            poVar16 = ::std::operator<<((ostream *)local_1288,"[error]");
            poVar16 = ::std::operator<<(poVar16,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       );
            poVar16 = ::std::operator<<(poVar16,":");
            poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
            poVar16 = ::std::operator<<(poVar16,"():");
            poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe6c);
            ::std::operator<<(poVar16," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_12c8,"Parsing attribute `{}` failed. Error: {}",&local_12c9);
            prop_name = (GeomMesh *)&ret_3;
            fmt::format<char[18],std::__cxx11::string>
                      (&local_12a8,(fmt *)local_12c8,(string *)"faceVertexIndices",
                       (char (*) [18])prop_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar16 = ::std::operator<<((ostream *)local_1288,(string *)&local_12a8);
            ::std::operator<<(poVar16,"\n");
            ::std::__cxx11::string::~string((string *)&local_12a8);
            ::std::__cxx11::string::~string(local_12c8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_12c9);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_12f0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (ret_4.err.field_2._M_local_buf + 8));
              ::std::__cxx11::string::operator=((string *)err,(string *)local_12f0);
              ::std::__cxx11::string::~string((string *)local_12f0);
              ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
            }
            spec_local._7_1_ = 0;
            __range2._4_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1288);
          }
          anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_10c8);
          if (__range2._4_4_ == 0) {
            ::std::__cxx11::string::string((string *)local_1358,(string *)local_a0);
            prop_name = (GeomMesh *)((long)local_a0 + 0x20);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1378,"cornerIndices",&local_1379);
            pPVar15 = (Property *)local_1378;
            (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                      ((ParseResult *)local_1338,(_anonymous_namespace_ *)local_78,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1358,(string *)prop_name,pPVar15,(string *)&mesh->cornerIndices,
                       (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                        *)target);
            ::std::__cxx11::string::~string((string *)local_1378);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1379);
            ::std::__cxx11::string::~string((string *)local_1358);
            if ((local_1338._0_4_ == Success) || (local_1338._0_4_ == AlreadyProcessed)) {
              __range2._4_4_ = 3;
            }
            else if (local_1338._0_4_ == Unmatched) {
              __range2._4_4_ = 0;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_14f8);
              poVar16 = ::std::operator<<((ostream *)local_14f8,"[error]");
              poVar16 = ::std::operator<<(poVar16,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         );
              poVar16 = ::std::operator<<(poVar16,":");
              poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
              poVar16 = ::std::operator<<(poVar16,"():");
              poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe6f);
              ::std::operator<<(poVar16," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1538,"Parsing attribute `{}` failed. Error: {}",&local_1539);
              prop_name = (GeomMesh *)&ret_4;
              fmt::format<char[14],std::__cxx11::string>
                        (&local_1518,(fmt *)local_1538,(string *)"cornerIndices",
                         (char (*) [14])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar15);
              poVar16 = ::std::operator<<((ostream *)local_14f8,(string *)&local_1518);
              ::std::operator<<(poVar16,"\n");
              ::std::__cxx11::string::~string((string *)&local_1518);
              ::std::__cxx11::string::~string(local_1538);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1539);
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1560,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(ret_5.err.field_2._M_local_buf + 8));
                ::std::__cxx11::string::operator=((string *)err,(string *)local_1560);
                ::std::__cxx11::string::~string((string *)local_1560);
                ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
              }
              spec_local._7_1_ = 0;
              __range2._4_4_ = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_14f8);
            }
            anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1338);
            if (__range2._4_4_ == 0) {
              ::std::__cxx11::string::string((string *)local_15c8,(string *)local_a0);
              prop_name = (GeomMesh *)((long)local_a0 + 0x20);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_15e8,"cornerSharpnesses",&local_15e9);
              pPVar15 = (Property *)local_15e8;
              (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                        ((ParseResult *)local_15a8,(_anonymous_namespace_ *)local_78,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_15c8,(string *)prop_name,pPVar15,
                         (string *)&mesh->cornerSharpnesses,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                          *)target);
              ::std::__cxx11::string::~string((string *)local_15e8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_15e9);
              ::std::__cxx11::string::~string((string *)local_15c8);
              if ((local_15a8._0_4_ == Success) || (local_15a8._0_4_ == AlreadyProcessed)) {
                __range2._4_4_ = 3;
              }
              else if (local_15a8._0_4_ == Unmatched) {
                __range2._4_4_ = 0;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1768);
                poVar16 = ::std::operator<<((ostream *)local_1768,"[error]");
                poVar16 = ::std::operator<<(poVar16,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar16 = ::std::operator<<(poVar16,":");
                poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                poVar16 = ::std::operator<<(poVar16,"():");
                poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe71);
                ::std::operator<<(poVar16," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_17a8,"Parsing attribute `{}` failed. Error: {}",&local_17a9);
                prop_name = (GeomMesh *)&ret_5;
                fmt::format<char[18],std::__cxx11::string>
                          (&local_1788,(fmt *)local_17a8,(string *)"cornerSharpnesses",
                           (char (*) [18])prop_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar15);
                poVar16 = ::std::operator<<((ostream *)local_1768,(string *)&local_1788);
                ::std::operator<<(poVar16,"\n");
                ::std::__cxx11::string::~string((string *)&local_1788);
                ::std::__cxx11::string::~string(local_17a8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_17a9);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_17d0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(ret_6.err.field_2._M_local_buf + 8));
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_17d0);
                  ::std::__cxx11::string::~string((string *)local_17d0);
                  ::std::__cxx11::string::~string((string *)(ret_6.err.field_2._M_local_buf + 8));
                }
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_1768);
              }
              anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_15a8);
              if (__range2._4_4_ == 0) {
                ::std::__cxx11::string::string((string *)local_1838,(string *)local_a0);
                prop_name = (GeomMesh *)((long)local_a0 + 0x20);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_1858,"creaseIndices",&local_1859);
                pPVar15 = (Property *)local_1858;
                (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                          ((ParseResult *)local_1818,(_anonymous_namespace_ *)local_78,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1838,(string *)prop_name,pPVar15,(string *)&mesh->creaseIndices,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                            *)target);
                ::std::__cxx11::string::~string((string *)local_1858);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1859);
                ::std::__cxx11::string::~string((string *)local_1838);
                if ((local_1818._0_4_ == Success) || (local_1818._0_4_ == AlreadyProcessed)) {
                  __range2._4_4_ = 3;
                }
                else if (local_1818._0_4_ == Unmatched) {
                  __range2._4_4_ = 0;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_19d8);
                  poVar16 = ::std::operator<<((ostream *)local_19d8,"[error]");
                  poVar16 = ::std::operator<<(poVar16,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             );
                  poVar16 = ::std::operator<<(poVar16,":");
                  poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                  poVar16 = ::std::operator<<(poVar16,"():");
                  poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe73);
                  ::std::operator<<(poVar16," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_1a18,"Parsing attribute `{}` failed. Error: {}",&local_1a19);
                  prop_name = (GeomMesh *)&ret_6;
                  fmt::format<char[14],std::__cxx11::string>
                            (&local_19f8,(fmt *)local_1a18,(string *)"creaseIndices",
                             (char (*) [14])prop_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar15);
                  poVar16 = ::std::operator<<((ostream *)local_19d8,(string *)&local_19f8);
                  ::std::operator<<(poVar16,"\n");
                  ::std::__cxx11::string::~string((string *)&local_19f8);
                  ::std::__cxx11::string::~string(local_1a18);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_1a19);
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::operator+(local_1a40,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(ret_7.err.field_2._M_local_buf + 8));
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_1a40);
                    ::std::__cxx11::string::~string((string *)local_1a40);
                    ::std::__cxx11::string::~string((string *)(ret_7.err.field_2._M_local_buf + 8));
                  }
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                  ::std::__cxx11::ostringstream::~ostringstream(local_19d8);
                }
                anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1818);
                if (__range2._4_4_ == 0) {
                  ::std::__cxx11::string::string((string *)local_1aa8,(string *)local_a0);
                  prop_name = (GeomMesh *)((long)local_a0 + 0x20);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_1ac8,"creaseLengths",&local_1ac9);
                  pPVar15 = (Property *)local_1ac8;
                  (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                            ((ParseResult *)local_1a88,(_anonymous_namespace_ *)local_78,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1aa8,(string *)prop_name,pPVar15,
                             (string *)&mesh->creaseLengths,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                              *)target);
                  ::std::__cxx11::string::~string((string *)local_1ac8);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_1ac9);
                  ::std::__cxx11::string::~string((string *)local_1aa8);
                  if ((local_1a88._0_4_ == Success) || (local_1a88._0_4_ == AlreadyProcessed)) {
                    __range2._4_4_ = 3;
                  }
                  else if (local_1a88._0_4_ == Unmatched) {
                    __range2._4_4_ = 0;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_1c48);
                    poVar16 = ::std::operator<<((ostream *)local_1c48,"[error]");
                    poVar16 = ::std::operator<<(poVar16,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               );
                    poVar16 = ::std::operator<<(poVar16,":");
                    poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                    poVar16 = ::std::operator<<(poVar16,"():");
                    poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe75);
                    ::std::operator<<(poVar16," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1c88,"Parsing attribute `{}` failed. Error: {}",&local_1c89);
                    prop_name = (GeomMesh *)&ret_7;
                    fmt::format<char[14],std::__cxx11::string>
                              (&local_1c68,(fmt *)local_1c88,(string *)"creaseLengths",
                               (char (*) [14])prop_name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar15);
                    poVar16 = ::std::operator<<((ostream *)local_1c48,(string *)&local_1c68);
                    ::std::operator<<(poVar16,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1c68);
                    ::std::__cxx11::string::~string(local_1c88);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1c89);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(local_1cb0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(ret_8.err.field_2._M_local_buf + 8));
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_1cb0);
                      ::std::__cxx11::string::~string((string *)local_1cb0);
                      ::std::__cxx11::string::~string
                                ((string *)(ret_8.err.field_2._M_local_buf + 8));
                    }
                    spec_local._7_1_ = 0;
                    __range2._4_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1c48);
                  }
                  anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1a88);
                  if (__range2._4_4_ == 0) {
                    ::std::__cxx11::string::string((string *)local_1d18,(string *)local_a0);
                    prop_name = (GeomMesh *)((long)local_a0 + 0x20);
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              ((string *)local_1d38,"creaseSharpnesses",&local_1d39);
                    pPVar15 = (Property *)local_1d38;
                    (anonymous_namespace)::
                    ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                              ((ParseResult *)(local_1d18 + 0x20),(_anonymous_namespace_ *)local_78,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1d18,(string *)prop_name,pPVar15,
                               (string *)&mesh->creaseSharpnesses,
                               (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                                *)target);
                    ::std::__cxx11::string::~string((string *)local_1d38);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1d39);
                    ::std::__cxx11::string::~string((string *)local_1d18);
                    if ((local_1d18._32_4_ == 0) || (local_1d18._32_4_ == 2)) {
                      __range2._4_4_ = 3;
                    }
                    else if (local_1d18._32_4_ == 1) {
                      __range2._4_4_ = 0;
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_1eb8);
                      poVar16 = ::std::operator<<((ostream *)local_1eb8,"[error]");
                      poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 );
                      poVar16 = ::std::operator<<(poVar16,":");
                      poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                      poVar16 = ::std::operator<<(poVar16,"():");
                      poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe77);
                      ::std::operator<<(poVar16," ");
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                (local_1ef8,"Parsing attribute `{}` failed. Error: {}",&local_1ef9);
                      prop_name = (GeomMesh *)&ret_8;
                      fmt::format<char[18],std::__cxx11::string>
                                (&local_1ed8,(fmt *)local_1ef8,(string *)"creaseSharpnesses",
                                 (char (*) [18])prop_name,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar15);
                      poVar16 = ::std::operator<<((ostream *)local_1eb8,(string *)&local_1ed8);
                      ::std::operator<<(poVar16,"\n");
                      ::std::__cxx11::string::~string((string *)&local_1ed8);
                      ::std::__cxx11::string::~string(local_1ef8);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_1ef9);
                      if (err != (string *)0x0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::operator+(local_1f20,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(ret_9.err.field_2._M_local_buf + 8));
                        ::std::__cxx11::string::operator=((string *)err,(string *)local_1f20);
                        ::std::__cxx11::string::~string((string *)local_1f20);
                        ::std::__cxx11::string::~string
                                  ((string *)(ret_9.err.field_2._M_local_buf + 8));
                      }
                      spec_local._7_1_ = 0;
                      __range2._4_4_ = 1;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1eb8);
                    }
                    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_1d18 + 0x20));
                    if (__range2._4_4_ == 0) {
                      ::std::__cxx11::string::string((string *)local_1f88,(string *)local_a0);
                      prop_name = (GeomMesh *)((long)local_a0 + 0x20);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string((string *)local_1fa8,"holeIndices",&local_1fa9)
                      ;
                      pPVar15 = (Property *)local_1fa8;
                      (anonymous_namespace)::
                      ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                                ((ParseResult *)(local_1f88 + 0x20),
                                 (_anonymous_namespace_ *)local_78,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_1f88,(string *)prop_name,pPVar15,
                                 (string *)&mesh->holeIndices,
                                 (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                  *)target);
                      ::std::__cxx11::string::~string((string *)local_1fa8);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_1fa9);
                      ::std::__cxx11::string::~string((string *)local_1f88);
                      if ((local_1f88._32_4_ == 0) || (local_1f88._32_4_ == 2)) {
                        __range2._4_4_ = 3;
                      }
                      else if (local_1f88._32_4_ == 1) {
                        __range2._4_4_ = 0;
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_2128);
                        poVar16 = ::std::operator<<((ostream *)local_2128,"[error]");
                        poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar16 = ::std::operator<<(poVar16,":");
                        poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                        poVar16 = ::std::operator<<(poVar16,"():");
                        poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe79);
                        ::std::operator<<(poVar16," ");
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string
                                  (local_2168,"Parsing attribute `{}` failed. Error: {}",&local_2169
                                  );
                        prop_name = (GeomMesh *)&ret_9;
                        fmt::format<char[12],std::__cxx11::string>
                                  (&local_2148,(fmt *)local_2168,(string *)"holeIndices",
                                   (char (*) [12])prop_name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar15);
                        poVar16 = ::std::operator<<((ostream *)local_2128,(string *)&local_2148);
                        ::std::operator<<(poVar16,"\n");
                        ::std::__cxx11::string::~string((string *)&local_2148);
                        ::std::__cxx11::string::~string(local_2168);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_2169);
                        if (err != (string *)0x0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::operator+(local_2190,local_21b0);
                          ::std::__cxx11::string::operator=((string *)err,(string *)local_2190);
                          ::std::__cxx11::string::~string((string *)local_2190);
                          ::std::__cxx11::string::~string((string *)local_21b0);
                        }
                        spec_local._7_1_ = 0;
                        __range2._4_4_ = 1;
                        ::std::__cxx11::ostringstream::~ostringstream(local_2128);
                      }
                      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_1f88 + 0x20));
                      if (__range2._4_4_ == 0) {
                        bVar3 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a0,"subdivisionScheme");
                        if (bVar3) {
                          ::std::allocator<char>::allocator();
                          ::std::__cxx11::string::string
                                    ((string *)local_21d0,"subdivisionScheme",&local_21d1);
                          sVar14 = ::std::
                                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_78,local_21d0);
                          ::std::__cxx11::string::~string((string *)local_21d0);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_21d1);
                          if (sVar14 == 0) {
                            Property::value_type_name_abi_cxx11_
                                      (&local_21f8,(Property *)((long)local_a0 + 0x20));
                            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                            _Var4 = ::std::operator==(&local_21f8,&local_2218);
                            prop_name = (GeomMesh *)CONCAT71((int7)((ulong)prop_name >> 8),_Var4);
                            local_34f9 = false;
                            if (_Var4) {
                              bVar3 = Property::is_attribute((Property *)((long)local_a0 + 0x20));
                              prop_name = (GeomMesh *)CONCAT71((int7)((ulong)prop_name >> 8),bVar3);
                              local_34f9 = false;
                              if (bVar3) {
                                local_34f9 = Property::is_empty((Property *)((long)local_a0 + 0x20))
                                ;
                              }
                            }
                            ::std::__cxx11::string::~string((string *)&local_2218);
                            ::std::__cxx11::string::~string((string *)&local_21f8);
                            if (local_34f9 == false) {
                              fun._M_invoker =
                                   (_Invoker_type)
                                   Property::get_attribute((Property *)((long)local_a0 + 0x20));
                              ::std::
                              function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,std::__cxx11::string>(std::__cxx11::string_const&)>
                              ::
                              function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomMesh*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__0&,void>
                                        ((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,std::__cxx11::string>(std::__cxx11::string_const&)>
                                          *)local_2430,
                                         (anon_class_1_0_00000001 *)
                                         ((long)&table._M_t._M_impl.super__Rb_tree_header.
                                                 _M_node_count + 7));
                              ::std::allocator<char>::allocator();
                              ::std::__cxx11::string::string
                                        ((string *)&local_2450,"subdivisionScheme",&local_2451);
                              bVar3 = options->strict_allowedToken_check;
                              ::std::
                              function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::function(&local_2478,
                                         (function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)local_2430);
                              prop_name = (GeomMesh *)fun._M_invoker;
                              target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                        *)err;
                              bVar3 = ParseUniformEnumProperty<tinyusdz::GeomMesh::SubdivisionScheme,tinyusdz::GeomMesh::SubdivisionScheme>
                                                (&local_2450,(bool)(bVar3 & 1),&local_2478,
                                                 (Attribute *)fun._M_invoker,
                                                 &mesh->subdivisionScheme,warn,err);
                              ::std::
                              function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::~function(&local_2478);
                              ::std::__cxx11::string::~string((string *)&local_2450);
                              ::std::allocator<char>::~allocator((allocator<char> *)&local_2451);
                              if (((bVar3 ^ 0xffU) & 1) == 0) {
                                pAVar10 = Attribute::metas((Attribute *)fun._M_invoker);
                                pAVar11 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>
                                          ::metas(&mesh->subdivisionScheme);
                                AttrMetas::operator=(pAVar11,pAVar10);
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          ((string *)local_2498,"subdivisionScheme",&local_2499);
                                pVar17 = ::std::
                                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::insert((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_78,local_2498);
                                local_24d0[4].loc = (int64_t)pVar17.first._M_node;
                                local_24d0[5].loc._0_1_ = pVar17.second;
                                ::std::__cxx11::string::~string((string *)local_2498);
                                ::std::allocator<char>::~allocator((allocator<char> *)&local_2499);
                                __range2._4_4_ = 3;
                              }
                              else {
                                spec_local._7_1_ = 0;
                                __range2._4_4_ = 1;
                              }
                              ::std::
                              function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::SubdivisionScheme,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                           *)local_2430);
                              goto joined_r0x002c4343;
                            }
                            ::std::__cxx11::ostringstream::ostringstream(local_2390);
                            poVar16 = ::std::operator<<((ostream *)local_2390,"[warn]");
                            poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                            poVar16 = ::std::operator<<(poVar16,":");
                            poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                            poVar16 = ::std::operator<<(poVar16,"():");
                            poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe7c);
                            ::std::operator<<(poVar16," ");
                            poVar16 = ::std::operator<<((ostream *)local_2390,
                                                        "No value assigned to `");
                            poVar16 = ::std::operator<<(poVar16,"subdivisionScheme");
                            poVar16 = ::std::operator<<(poVar16,
                                                  "` token attribute. Set default token value.");
                            ::std::operator<<(poVar16,"\n");
                            if (warn != (string *)0x0) {
                              ::std::__cxx11::ostringstream::str();
                              ::std::operator+(local_23b0,local_23d0);
                              ::std::__cxx11::string::operator=((string *)warn,(string *)local_23b0)
                              ;
                              ::std::__cxx11::string::~string((string *)local_23b0);
                              ::std::__cxx11::string::~string((string *)local_23d0);
                            }
                            ::std::__cxx11::ostringstream::~ostringstream(local_2390);
                            pAVar9 = Property::get_attribute((Property *)((long)local_a0 + 0x20));
                            pAVar10 = Attribute::metas(pAVar9);
                            pAVar11 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>
                                      ::metas(&mesh->subdivisionScheme);
                            AttrMetas::operator=(pAVar11,pAVar10);
                            ::std::allocator<char>::allocator();
                            ::std::__cxx11::string::string
                                      ((string *)local_23f0,"subdivisionScheme",&local_23f1);
                            ::std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_78,local_23f0);
                            ::std::__cxx11::string::~string((string *)local_23f0);
                            ::std::allocator<char>::~allocator((allocator<char> *)&local_23f1);
                          }
                        }
                        else {
                          bVar3 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a0,"interpolateBoundary");
                          if (bVar3) {
                            ::std::allocator<char>::allocator();
                            ::std::__cxx11::string::string
                                      ((string *)local_24d0,"interpolateBoundary",&local_24d1);
                            sVar14 = ::std::
                                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_78,local_24d0);
                            ::std::__cxx11::string::~string((string *)local_24d0);
                            ::std::allocator<char>::~allocator((allocator<char> *)&local_24d1);
                            if (sVar14 == 0) {
                              Property::value_type_name_abi_cxx11_
                                        (&local_24f8,(Property *)((long)local_a0 + 0x20));
                              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                              _Var4 = ::std::operator==(&local_24f8,&local_2518);
                              prop_name = (GeomMesh *)CONCAT71((int7)((ulong)prop_name >> 8),_Var4);
                              local_3521 = false;
                              if (_Var4) {
                                bVar3 = Property::is_attribute((Property *)((long)local_a0 + 0x20));
                                prop_name = (GeomMesh *)
                                            CONCAT71((int7)((ulong)prop_name >> 8),bVar3);
                                local_3521 = false;
                                if (bVar3) {
                                  local_3521 = Property::is_empty((Property *)
                                                                  ((long)local_a0 + 0x20));
                                }
                              }
                              ::std::__cxx11::string::~string((string *)&local_2518);
                              ::std::__cxx11::string::~string((string *)&local_24f8);
                              if (local_3521 == false) {
                                fun_1._M_invoker =
                                     (_Invoker_type)
                                     Property::get_attribute((Property *)((long)local_a0 + 0x20));
                                ::std::
                                function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,std::__cxx11::string>(std::__cxx11::string_const&)>
                                ::
                                function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomMesh*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__1&,void>
                                          ((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,std::__cxx11::string>(std::__cxx11::string_const&)>
                                            *)local_2738,
                                           (anon_class_1_0_00000001 *)
                                           ((long)&table._M_t._M_impl.super__Rb_tree_header.
                                                   _M_node_count + 6));
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          ((string *)&local_2758,"interpolateBoundary",&local_2759);
                                bVar3 = options->strict_allowedToken_check;
                                ::std::
                                function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                ::function(&local_2780,
                                           (function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                            *)local_2738);
                                prop_name = (GeomMesh *)fun_1._M_invoker;
                                target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                          *)err;
                                bVar3 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::InterpolateBoundary,tinyusdz::GeomMesh::InterpolateBoundary>
                                                  (&local_2758,(bool)(bVar3 & 1),&local_2780,
                                                   (Attribute *)fun_1._M_invoker,
                                                   &mesh->interpolateBoundary,warn,err);
                                ::std::
                                function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                ::~function(&local_2780);
                                ::std::__cxx11::string::~string((string *)&local_2758);
                                ::std::allocator<char>::~allocator((allocator<char> *)&local_2759);
                                if (((bVar3 ^ 0xffU) & 1) == 0) {
                                  pAVar10 = Attribute::metas((Attribute *)fun_1._M_invoker);
                                  pAVar11 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
                                            ::metas(&mesh->interpolateBoundary);
                                  AttrMetas::operator=(pAVar11,pAVar10);
                                  ::std::allocator<char>::allocator();
                                  ::std::__cxx11::string::string
                                            ((string *)local_27a0,"interpolateBoundary",&local_27a1)
                                  ;
                                  pVar17 = ::std::
                                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::insert((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_78,local_27a0);
                                  local_27d8[4].loc = (int64_t)pVar17.first._M_node;
                                  local_27d8[5].loc._0_1_ = pVar17.second;
                                  ::std::__cxx11::string::~string((string *)local_27a0);
                                  ::std::allocator<char>::~allocator((allocator<char> *)&local_27a1)
                                  ;
                                  __range2._4_4_ = 3;
                                }
                                else {
                                  spec_local._7_1_ = 0;
                                  __range2._4_4_ = 1;
                                }
                                ::std::
                                function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::InterpolateBoundary,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                             *)local_2738);
                                goto joined_r0x002c4343;
                              }
                              ::std::__cxx11::ostringstream::ostringstream(local_2690);
                              poVar16 = ::std::operator<<((ostream *)local_2690,"[warn]");
                              poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                              poVar16 = ::std::operator<<(poVar16,":");
                              poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                              poVar16 = ::std::operator<<(poVar16,"():");
                              poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe7f);
                              ::std::operator<<(poVar16," ");
                              poVar16 = ::std::operator<<((ostream *)local_2690,
                                                          "No value assigned to `");
                              poVar16 = ::std::operator<<(poVar16,"interpolateBoundary");
                              poVar16 = ::std::operator<<(poVar16,
                                                  "` token attribute. Set default token value.");
                              ::std::operator<<(poVar16,"\n");
                              if (warn != (string *)0x0) {
                                ::std::__cxx11::ostringstream::str();
                                ::std::operator+(local_26b0,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&attr_1);
                                ::std::__cxx11::string::operator=
                                          ((string *)warn,(string *)local_26b0);
                                ::std::__cxx11::string::~string((string *)local_26b0);
                                ::std::__cxx11::string::~string((string *)&attr_1);
                              }
                              ::std::__cxx11::ostringstream::~ostringstream(local_2690);
                              local_26f8[4].loc =
                                   (int64_t)Property::get_attribute
                                                      ((Property *)((long)local_a0 + 0x20));
                              pAVar10 = Attribute::metas((Attribute *)local_26f8[4].loc);
                              pAVar11 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
                                        ::metas(&mesh->interpolateBoundary);
                              AttrMetas::operator=(pAVar11,pAVar10);
                              ::std::allocator<char>::allocator();
                              ::std::__cxx11::string::string
                                        ((string *)local_26f8,"interpolateBoundary",&local_26f9);
                              ::std::
                              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_78,local_26f8);
                              ::std::__cxx11::string::~string((string *)local_26f8);
                              ::std::allocator<char>::~allocator((allocator<char> *)&local_26f9);
                            }
                          }
                          else {
                            bVar3 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a0,"facevaryingLinearInterpolation");
                            if (bVar3) {
                              ::std::allocator<char>::allocator();
                              ::std::__cxx11::string::string
                                        ((string *)local_27d8,"facevaryingLinearInterpolation",
                                         &local_27d9);
                              sVar14 = ::std::
                                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_78,local_27d8);
                              ::std::__cxx11::string::~string((string *)local_27d8);
                              ::std::allocator<char>::~allocator((allocator<char> *)&local_27d9);
                              if (sVar14 == 0) {
                                Property::value_type_name_abi_cxx11_
                                          (&local_2800,(Property *)((long)local_a0 + 0x20));
                                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_()
                                ;
                                _Var4 = ::std::operator==(&local_2800,&local_2820);
                                prop_name = (GeomMesh *)
                                            CONCAT71((int7)((ulong)prop_name >> 8),_Var4);
                                local_3549 = false;
                                if (_Var4) {
                                  bVar3 = Property::is_attribute
                                                    ((Property *)((long)local_a0 + 0x20));
                                  prop_name = (GeomMesh *)
                                              CONCAT71((int7)((ulong)prop_name >> 8),bVar3);
                                  local_3549 = false;
                                  if (bVar3) {
                                    local_3549 = Property::is_empty((Property *)
                                                                    ((long)local_a0 + 0x20));
                                  }
                                }
                                ::std::__cxx11::string::~string((string *)&local_2820);
                                ::std::__cxx11::string::~string((string *)&local_2800);
                                if (local_3549 == false) {
                                  fun_2._M_invoker =
                                       (_Invoker_type)
                                       Property::get_attribute((Property *)((long)local_a0 + 0x20));
                                  ::std::
                                  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,std::__cxx11::string>(std::__cxx11::string_const&)>
                                  ::
                                  function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomMesh*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__2&,void>
                                            ((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,std::__cxx11::string>(std::__cxx11::string_const&)>
                                              *)local_2a40,
                                             (anon_class_1_0_00000001 *)
                                             ((long)&table._M_t._M_impl.super__Rb_tree_header.
                                                     _M_node_count + 5));
                                  ::std::allocator<char>::allocator();
                                  ::std::__cxx11::string::string
                                            ((string *)&local_2a60,"facevaryingLinearInterpolation",
                                             &local_2a61);
                                  bVar3 = options->strict_allowedToken_check;
                                  ::std::
                                  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  ::function(&local_2a88,
                                             (function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                              *)local_2a40);
                                  prop_name = (GeomMesh *)fun_2._M_invoker;
                                  target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                            *)err;
                                  bVar3 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                                    (&local_2a60,(bool)(bVar3 & 1),&local_2a88,
                                                     (Attribute *)fun_2._M_invoker,
                                                     &mesh->faceVaryingLinearInterpolation,warn,err)
                                  ;
                                  ::std::
                                  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  ::~function(&local_2a88);
                                  ::std::__cxx11::string::~string((string *)&local_2a60);
                                  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a61)
                                  ;
                                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                                    pAVar10 = Attribute::metas((Attribute *)fun_2._M_invoker);
                                    pAVar11 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                                              ::metas(&mesh->faceVaryingLinearInterpolation);
                                    AttrMetas::operator=(pAVar11,pAVar10);
                                    ::std::allocator<char>::allocator();
                                    ::std::__cxx11::string::string
                                              ((string *)local_2aa8,"facevaryingLinearInterpolation"
                                               ,&local_2aa9);
                                    pVar17 = ::std::
                                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::insert((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_78,local_2aa8);
                                    ret_10.err.field_2._8_8_ = pVar17.first._M_node;
                                    ::std::__cxx11::string::~string((string *)local_2aa8);
                                    ::std::allocator<char>::~allocator
                                              ((allocator<char> *)&local_2aa9);
                                    __range2._4_4_ = 3;
                                  }
                                  else {
                                    spec_local._7_1_ = 0;
                                    __range2._4_4_ = 1;
                                  }
                                  ::std::
                                  function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                  ::~function((function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                               *)local_2a40);
                                  goto joined_r0x002c2fb2;
                                }
                                ::std::__cxx11::ostringstream::ostringstream(local_2998);
                                poVar16 = ::std::operator<<((ostream *)local_2998,"[warn]");
                                poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                poVar16 = ::std::operator<<(poVar16,":");
                                poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                                poVar16 = ::std::operator<<(poVar16,"():");
                                poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe82);
                                ::std::operator<<(poVar16," ");
                                poVar16 = ::std::operator<<((ostream *)local_2998,
                                                            "No value assigned to `");
                                poVar16 = ::std::operator<<(poVar16,"facevaryingLinearInterpolation"
                                                           );
                                poVar16 = ::std::operator<<(poVar16,
                                                  "` token attribute. Set default token value.");
                                ::std::operator<<(poVar16,"\n");
                                if (warn != (string *)0x0) {
                                  ::std::__cxx11::ostringstream::str();
                                  ::std::operator+(local_29b8,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&attr_3);
                                  ::std::__cxx11::string::operator=
                                            ((string *)warn,(string *)local_29b8);
                                  ::std::__cxx11::string::~string((string *)local_29b8);
                                  ::std::__cxx11::string::~string((string *)&attr_3);
                                }
                                ::std::__cxx11::ostringstream::~ostringstream(local_2998);
                                local_2a00[4].loc =
                                     (int64_t)Property::get_attribute
                                                        ((Property *)((long)local_a0 + 0x20));
                                pAVar10 = Attribute::metas((Attribute *)local_2a00[4].loc);
                                pAVar11 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                                          ::metas(&mesh->faceVaryingLinearInterpolation);
                                AttrMetas::operator=(pAVar11,pAVar10);
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          ((string *)local_2a00,"facevaryingLinearInterpolation",
                                           &local_2a01);
                                ::std::
                                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_78,local_2a00);
                                ::std::__cxx11::string::~string((string *)local_2a00);
                                ::std::allocator<char>::~allocator((allocator<char> *)&local_2a01);
                              }
                            }
                            else {
                              ::std::__cxx11::string::string
                                        ((string *)local_2b08,(string *)local_a0);
                              prop_name = (GeomMesh *)((long)local_a0 + 0x20);
                              ::std::allocator<char>::allocator();
                              ::std::__cxx11::string::string
                                        ((string *)local_2b28,"skel:blendShapes",&local_2b29);
                              pPVar15 = (Property *)local_2b28;
                              (anonymous_namespace)::
                              ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                        ((ParseResult *)(local_2b08 + 0x20),
                                         (_anonymous_namespace_ *)local_78,
                                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_2b08,(string *)prop_name,pPVar15,
                                         (string *)&mesh->blendShapes,
                                         (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                          *)target);
                              ::std::__cxx11::string::~string((string *)local_2b28);
                              ::std::allocator<char>::~allocator((allocator<char> *)&local_2b29);
                              ::std::__cxx11::string::~string((string *)local_2b08);
                              if ((local_2b08._32_4_ == 0) || (local_2b08._32_4_ == 2)) {
                                __range2._4_4_ = 3;
                              }
                              else if (local_2b08._32_4_ == 1) {
                                __range2._4_4_ = 0;
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream(local_2ca8);
                                poVar16 = ::std::operator<<((ostream *)local_2ca8,"[error]");
                                poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                poVar16 = ::std::operator<<(poVar16,":");
                                poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                                poVar16 = ::std::operator<<(poVar16,"():");
                                poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xe84);
                                ::std::operator<<(poVar16," ");
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          (local_2ce8,"Parsing attribute `{}` failed. Error: {}",
                                           &local_2ce9);
                                prop_name = (GeomMesh *)&ret_10;
                                fmt::format<char_const*,std::__cxx11::string>
                                          (&local_2cc8,(fmt *)local_2ce8,(string *)&kSkelBlendShapes
                                           ,(char **)prop_name,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)pPVar15);
                                poVar16 = ::std::operator<<((ostream *)local_2ca8,
                                                            (string *)&local_2cc8);
                                ::std::operator<<(poVar16,"\n");
                                ::std::__cxx11::string::~string((string *)&local_2cc8);
                                ::std::__cxx11::string::~string(local_2ce8);
                                ::std::allocator<char>::~allocator((allocator<char> *)&local_2ce9);
                                if (err != (string *)0x0) {
                                  ::std::__cxx11::ostringstream::str();
                                  ::std::operator+(local_2d10,local_2d30);
                                  ::std::__cxx11::string::operator=
                                            ((string *)err,(string *)local_2d10);
                                  ::std::__cxx11::string::~string((string *)local_2d10);
                                  ::std::__cxx11::string::~string((string *)local_2d30);
                                }
                                spec_local._7_1_ = 0;
                                __range2._4_4_ = 1;
                                ::std::__cxx11::ostringstream::~ostringstream(local_2ca8);
                              }
                              anon_unknown_0::ParseResult::~ParseResult
                                        ((ParseResult *)(local_2b08 + 0x20));
                              auVar2 = local_a0;
                              if (__range2._4_4_ != 0) goto joined_r0x002c2fb2;
                              ::std::allocator<char>::allocator();
                              ::std::__cxx11::string::string
                                        (local_2d50,"subsetFamily",
                                         (allocator *)
                                         ((long)&names.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 7));
                              bVar3 = startsWith((string *)auVar2,(string *)local_2d50);
                              ::std::__cxx11::string::~string(local_2d50);
                              ::std::allocator<char>::~allocator
                                        ((allocator<char> *)
                                         ((long)&names.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 7));
                              auVar2 = local_a0;
                              if (bVar3) {
                                ::std::allocator<char>::allocator();
                                ::std::__cxx11::string::string
                                          ((string *)&local_2d90,":",
                                           (allocator *)&familyType.field_0x237);
                                iVar5 = ::std::numeric_limits<int>::max();
                                prop_name = (GeomMesh *)((long)iVar5 / 100 & 0xffffffff);
                                split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_2d70,(string *)auVar2,&local_2d90,
                                      (uint32_t)((long)iVar5 / 100));
                                ::std::__cxx11::string::~string((string *)&local_2d90);
                                ::std::allocator<char>::~allocator
                                          ((allocator<char> *)&familyType.field_0x237);
                                sVar7 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_2d70);
                                if (sVar7 == 3) {
                                  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)::std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_2d70,0);
                                  bVar3 = ::std::operator==(pbVar8,"subsetFamily");
                                  if (!bVar3) goto LAB_002c5497;
                                  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)::std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_2d70,2);
                                  bVar3 = ::std::operator==(pbVar8,"familyType");
                                  if (!bVar3) goto LAB_002c5497;
                                  local_2fd4 = Unrestricted;
                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>::
                                  TypedAttributeWithFallback
                                            ((TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                              *)local_2fd0,&local_2fd4);
                                  _Var4 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a0,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a0);
                                  if (_Var4) {
                                    sVar14 = ::std::
                                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::count((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_78,(key_type *)local_a0);
                                    if (sVar14 == 0) {
                                      Property::value_type_name_abi_cxx11_
                                                (&local_2ff8,(Property *)((long)local_a0 + 0x20));
                                      tinyusdz::value::TypeTraits<tinyusdz::Token>::
                                      type_name_abi_cxx11_();
                                      _Var4 = ::std::operator==(&local_2ff8,&local_3018);
                                      prop_name = (GeomMesh *)
                                                  CONCAT71((int7)((ulong)prop_name >> 8),_Var4);
                                      local_3589 = false;
                                      if (_Var4) {
                                        bVar3 = Property::is_attribute
                                                          ((Property *)((long)local_a0 + 0x20));
                                        prop_name = (GeomMesh *)
                                                    CONCAT71((int7)((ulong)prop_name >> 8),bVar3);
                                        local_3589 = false;
                                        if (bVar3) {
                                          local_3589 = Property::is_empty((Property *)
                                                                          ((long)local_a0 + 0x20));
                                        }
                                      }
                                      ::std::__cxx11::string::~string((string *)&local_3018);
                                      ::std::__cxx11::string::~string((string *)&local_2ff8);
                                      if (local_3589 == false) {
                                        fun_3._M_invoker =
                                             (_Invoker_type)
                                             Property::get_attribute
                                                       ((Property *)((long)local_a0 + 0x20));
                                        ::std::
                                        function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,std::__cxx11::string>(std::__cxx11::string_const&)>
                                        ::
                                        function<tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>(tinyusdz::Specifier_const&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,std::pair<tinyusdz::ListEditQual,std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>const&,tinyusdz::GeomMesh*,std::__cxx11::string*,std::__cxx11::string*,tinyusdz::prim::PrimReconstructOptions_const&)::__3&,void>
                                                  ((
                                                  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,std::__cxx11::string>(std::__cxx11::string_const&)>
                                                  *)local_3208,
                                                  (anon_class_1_0_00000001 *)
                                                  ((long)&table._M_t._M_impl.super__Rb_tree_header.
                                                          _M_node_count + 4));
                                        auVar2 = local_a0;
                                        bVar3 = options->strict_allowedToken_check;
                                        ::std::
                                        function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        ::function(&local_3228,
                                                   (
                                                  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                                  *)local_3208);
                                        prop_name = (GeomMesh *)fun_3._M_invoker;
                                        target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                                  *)err;
                                        bVar3 = ParseUniformEnumProperty<tinyusdz::GeomSubset::FamilyType,tinyusdz::GeomSubset::FamilyType>
                                                          ((string *)auVar2,(bool)(bVar3 & 1),
                                                           &local_3228,(Attribute *)fun_3._M_invoker
                                                           ,(
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)local_2fd0,warn,err);
                                        ::std::
                                        function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        ::~function(&local_3228);
                                        if (((bVar3 ^ 0xffU) & 1) == 0) {
                                          pAVar10 = Attribute::metas((Attribute *)fun_3._M_invoker);
                                          pAVar11 = 
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  ::metas((
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)local_2fd0);
                                          AttrMetas::operator=(pAVar11,pAVar10);
                                          pVar17 = ::std::
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::insert((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_78,(value_type *)local_a0);
                                          local_3238 = (_Base_ptr)pVar17.first._M_node;
                                          local_3230 = pVar17.second;
                                          __range2._4_4_ = 3;
                                        }
                                        else {
                                          spec_local._7_1_ = 0;
                                          __range2._4_4_ = 1;
                                        }
                                        ::std::
                                        function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        ::~function((
                                                  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                                  *)local_3208);
                                      }
                                      else {
                                        ::std::__cxx11::ostringstream::ostringstream(local_3190);
                                        poVar16 = ::std::operator<<((ostream *)local_3190,"[warn]");
                                        poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                        poVar16 = ::std::operator<<(poVar16,":");
                                        poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                                        poVar16 = ::std::operator<<(poVar16,"():");
                                        poVar16 = (ostream *)
                                                  ::std::ostream::operator<<(poVar16,0xe94);
                                        ::std::operator<<(poVar16," ");
                                        poVar16 = ::std::operator<<((ostream *)local_3190,
                                                                    "No value assigned to `");
                                        poVar16 = ::std::operator<<(poVar16,(string *)local_a0);
                                        poVar16 = ::std::operator<<(poVar16,
                                                  "` token attribute. Set default token value.");
                                        ::std::operator<<(poVar16,"\n");
                                        if (warn != (string *)0x0) {
                                          ::std::__cxx11::ostringstream::str();
                                          ::std::operator+(local_31b0,local_31d0);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)warn,(string *)local_31b0);
                                          ::std::__cxx11::string::~string((string *)local_31b0);
                                          ::std::__cxx11::string::~string((string *)local_31d0);
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream(local_3190);
                                        pAVar9 = Property::get_attribute
                                                           ((Property *)((long)local_a0 + 0x20));
                                        pAVar10 = Attribute::metas(pAVar9);
                                        pAVar11 = TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  ::metas((
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)local_2fd0);
                                        AttrMetas::operator=(pAVar11,pAVar10);
                                        ::std::
                                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_78,(value_type *)local_a0);
                                        __range2._4_4_ = 3;
                                      }
                                    }
                                    else {
                                      __range2._4_4_ = 3;
                                    }
                                  }
                                  else {
                                    pFVar12 = TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                              ::get_value((
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)local_2fd0);
                                    FVar1 = *pFVar12;
                                    str = (string *)
                                          ::std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_2d70,1);
                                    Token::Token(&local_3258,str);
                                    pmVar13 = ::std::
                                              map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
                                              ::operator[](&mesh->subsetFamilyTypeMap,&local_3258);
                                    prop_name = (GeomMesh *)(ulong)FVar1;
                                    *pmVar13 = FVar1;
                                    Token::~Token(&local_3258);
                                    __range2._4_4_ = 0;
                                  }
                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>::
                                  ~TypedAttributeWithFallback
                                            ((TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                              *)local_2fd0);
                                  if (__range2._4_4_ == 0) goto LAB_002c5497;
                                }
                                else {
LAB_002c5497:
                                  __range2._4_4_ = 0;
                                }
                                ::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_2d70);
                                if (__range2._4_4_ != 0) goto joined_r0x002c2fb2;
                              }
                              sVar14 = ::std::
                                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_78,(key_type *)local_a0);
                              if (sVar14 == 0) {
                                pPVar15 = (Property *)((long)local_a0 + 0x20);
                                this = ::std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                       ::operator[](&(mesh->super_GPrim).props,(key_type *)local_a0)
                                ;
                                Property::operator=(this,pPVar15);
                                ::std::
                                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_78,(value_type *)local_a0);
                              }
                              sVar14 = ::std::
                                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_78,(key_type *)local_a0);
                              if (sVar14 == 0) {
                                ::std::__cxx11::ostringstream::ostringstream(local_33e0);
                                poVar16 = ::std::operator<<((ostream *)local_33e0,"[warn]");
                                poVar16 = ::std::operator<<(poVar16,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                                poVar16 = ::std::operator<<(poVar16,":");
                                poVar16 = ::std::operator<<(poVar16,"ReconstructPrim");
                                poVar16 = ::std::operator<<(poVar16,"():");
                                poVar16 = (ostream *)::std::ostream::operator<<(poVar16,0xea0);
                                ::std::operator<<(poVar16," ");
                                ::std::operator+((char *)local_3400,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Unsupported/unimplemented property: ");
                                poVar16 = ::std::operator<<((ostream *)local_33e0,local_3400);
                                ::std::operator<<(poVar16,"\n");
                                ::std::__cxx11::string::~string(local_3400);
                                if (warn != (string *)0x0) {
                                  ::std::__cxx11::ostringstream::str();
                                  ::std::operator+(local_3420,local_3440);
                                  ::std::__cxx11::string::operator=
                                            ((string *)warn,(string *)local_3420);
                                  ::std::__cxx11::string::~string((string *)local_3420);
                                  ::std::__cxx11::string::~string((string *)local_3440);
                                }
                                ::std::__cxx11::ostringstream::~ostringstream(local_33e0);
                              }
                            }
                          }
                        }
                        goto LAB_002c5680;
                      }
                    }
                  }
                }
              }
            }
          }
        }
joined_r0x002c2fb2:
        if (__range2._4_4_ == 3) goto LAB_002c5680;
        goto LAB_002c569c;
      }
    }
joined_r0x002c4343:
    if (__range2._4_4_ != 3) goto LAB_002c569c;
  }
LAB_002c5680:
  ::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
  ::operator++(&__end2);
  goto LAB_002c1cd7;
LAB_002c5691:
  spec_local._7_1_ = 1;
LAB_002c569c:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_78);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<GeomMesh>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomMesh *mesh,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  DCOUT("GeomMesh");

  auto SubdivisionSchemeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::SubdivisionScheme, std::string> {
    using EnumTy = std::pair<GeomMesh::SubdivisionScheme, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::SubdivisionScheme::SubdivisionSchemeNone, "none"),
        std::make_pair(GeomMesh::SubdivisionScheme::CatmullClark,
                       "catmullClark"),
        std::make_pair(GeomMesh::SubdivisionScheme::Loop, "loop"),
        std::make_pair(GeomMesh::SubdivisionScheme::Bilinear, "bilinear"),
    };
    return EnumHandler<GeomMesh::SubdivisionScheme>("subdivisionScheme", tok,
                                                    enums);
  };

  auto InterpolateBoundaryHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::InterpolateBoundary, std::string> {
    using EnumTy = std::pair<GeomMesh::InterpolateBoundary, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::InterpolateBoundary::InterpolateBoundaryNone, "none"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeAndCorner,
                       "edgeAndCorner"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeOnly, "edgeOnly"),
    };
    return EnumHandler<GeomMesh::InterpolateBoundary>("interpolateBoundary",
                                                      tok, enums);
  };

  auto FaceVaryingLinearInterpolationHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::FaceVaryingLinearInterpolation,
                          std::string> {
    using EnumTy =
        std::pair<GeomMesh::FaceVaryingLinearInterpolation, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus1,
                       "cornersPlus1"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus2,
                       "cornersPlus2"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersOnly,
                       "cornersOnly"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::Boundaries,
                       "boundaries"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::FaceVaryingLinearInterpolationNone, "none"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::All, "all"),
    };
    return EnumHandler<GeomMesh::FaceVaryingLinearInterpolation>(
        "facevaryingLinearInterpolation", tok, enums);
  };

  auto FamilyTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::FamilyType, std::string> {
    using EnumTy = std::pair<GeomSubset::FamilyType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::FamilyType::Partition, "partition"),
        std::make_pair(GeomSubset::FamilyType::NonOverlapping, "nonOverlapping"),
        std::make_pair(GeomSubset::FamilyType::Unrestricted, "unrestricted"),
    };
    return EnumHandler<GeomSubset::FamilyType>("familyType", tok,
                                                    enums);
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, mesh, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("GeomMesh prop: " << prop.first);
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kSkelSkeleton, mesh->skeleton)
    PARSE_TARGET_PATHS_RELATION(table, prop, kSkelBlendShapeTargets, mesh->blendShapeTargets)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomMesh, mesh->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomMesh, mesh->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexCounts", GeomMesh,
                         mesh->faceVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexIndices", GeomMesh,
                         mesh->faceVertexIndices)
    // Subd
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerIndices", GeomMesh,
                         mesh->cornerIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerSharpnesses", GeomMesh,
                         mesh->cornerSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseIndices", GeomMesh,
                         mesh->creaseIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseLengths", GeomMesh,
                         mesh->creaseLengths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseSharpnesses", GeomMesh,
                         mesh->creaseSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "holeIndices", GeomMesh,
                         mesh->holeIndices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "subdivisionScheme", GeomMesh::SubdivisionScheme,
                       SubdivisionSchemeHandler, GeomMesh,
                       mesh->subdivisionScheme, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "interpolateBoundary",
                       GeomMesh::InterpolateBoundary, InterpolateBoundaryHandler, GeomMesh,
                       mesh->interpolateBoundary, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "facevaryingLinearInterpolation",
                       GeomMesh::FaceVaryingLinearInterpolation, FaceVaryingLinearInterpolationHandler, GeomMesh,
                       mesh->faceVaryingLinearInterpolation, options.strict_allowedToken_check)
    // blendShape names
    PARSE_TYPED_ATTRIBUTE(table, prop, kSkelBlendShapes, GeomMesh, mesh->blendShapes)

    // subsetFamily for GeomSubset
    if (startsWith(prop.first, "subsetFamily")) {
      // uniform subsetFamily::<FAMILYNAME>:familyType = ...
      std::vector<std::string> names = split(prop.first, ":");

      if ((names.size() == 3) &&
          (names[0] == "subsetFamily") &&
          (names[2] == "familyType")) {

        DCOUT("subsetFamily" << prop.first);
        TypedAttributeWithFallback<GeomSubset::FamilyType> familyType{GeomSubset::FamilyType::Unrestricted};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first,
                           GeomSubset::FamilyType, FamilyTypeHandler, GeomMesh,
                           familyType, options.strict_allowedToken_check)

        // NOTE: Ignore metadataum of familyType.
        
        // TODO: Validate familyName
        mesh->subsetFamilyTypeMap[value::token(names[1])] = familyType.get_value();

      }
    }

    // generic
    ADD_PROPERTY(table, prop, GeomMesh, mesh->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }


  return true;
}